

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_client_request.cxx
# Opt level: O0

ptr<resp_msg> __thiscall
nuraft::raft_server::handle_cli_req_callback
          (raft_server *this,ptr<commit_ret_elem> *elem,ptr<resp_msg> *resp)

{
  uint64_t uVar1;
  bool bVar2;
  int iVar3;
  element_type *peVar4;
  size_type sVar5;
  element_type *peVar6;
  element_type *peVar7;
  element_type *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  raft_server *in_RDI;
  ptr<resp_msg> pVar8;
  bool valid_leader;
  lock_guard<std::mutex> guard;
  ptr<buffer> ret_value;
  uint64_t elapsed_us;
  uint64_t idx;
  mutex_type *in_stack_fffffffffffffd98;
  resp_msg *in_stack_fffffffffffffda0;
  context *in_stack_fffffffffffffdb8;
  timer_helper *in_stack_fffffffffffffde0;
  ulong uVar9;
  raft_server *this_01;
  string local_150 [32];
  string local_130 [39];
  undefined1 local_109;
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [40];
  __shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2> local_80;
  uint64_t local_70;
  ulong local_68;
  string local_40 [64];
  
  this_01 = in_RDI;
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
  if (bVar2) {
    peVar6 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x464173);
    iVar3 = (**(code **)(*(long *)peVar6 + 0x38))();
    if (4 < iVar3) {
      peVar6 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x464199);
      peVar4 = std::
               __shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x4641ae);
      uVar9 = peVar4->idx_;
      peVar4 = std::
               __shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x4641c6);
      msg_if_given_abi_cxx11_((char *)local_40,"commit_ret_cv %lu %p sleep",uVar9,&peVar4->awaiter_)
      ;
      (**(code **)(*(long *)peVar6 + 0x40))
                (peVar6,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_client_request.cxx"
                 ,"handle_cli_req_callback",0xd4,local_40);
      std::__cxx11::string::~string(local_40);
    }
  }
  std::
  __shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x464269);
  std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
            ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x464289);
  nuraft::context::get_params(in_stack_fffffffffffffdb8);
  std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x4642ae);
  EventAwaiter::wait_ms((EventAwaiter *)in_stack_fffffffffffffda0,(size_t)in_stack_fffffffffffffd98)
  ;
  std::shared_ptr<nuraft::raft_params>::~shared_ptr((shared_ptr<nuraft::raft_params> *)0x4642ce);
  local_68 = 0;
  local_70 = 0;
  std::shared_ptr<nuraft::buffer>::shared_ptr
            ((shared_ptr<nuraft::buffer> *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  peVar4 = std::
           __shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x464322);
  local_68 = peVar4->idx_;
  std::
  __shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x46433a);
  local_70 = timer_helper::get_us(in_stack_fffffffffffffde0);
  std::
  __shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x46436d);
  std::shared_ptr<nuraft::buffer>::operator=
            ((shared_ptr<nuraft::buffer> *)in_stack_fffffffffffffda0,
             (shared_ptr<nuraft::buffer> *)in_stack_fffffffffffffd98);
  peVar4 = std::
           __shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x464391);
  peVar4->callback_invoked_ = true;
  peVar4 = std::
           __shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x4643a5);
  if (peVar4->result_code_ == TIMEOUT) {
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
    if (bVar2) {
      peVar6 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x464475);
      iVar3 = (**(code **)(*(long *)peVar6 + 0x38))();
      if (4 < iVar3) {
        peVar6 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x4644ae);
        msg_if_given_abi_cxx11_
                  ((char *)local_a8,
                   "Client timeout leave commit thread to remove commit_ret_elem %lu",local_68);
        (**(code **)(*(long *)peVar6 + 0x40))
                  (peVar6,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_client_request.cxx"
                   ,"handle_cli_req_callback",0xe5,local_a8);
        std::__cxx11::string::~string(local_a8);
      }
    }
  }
  else {
    std::
    __shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x4643d5);
    std::
    map<unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>_>
    ::erase((map<unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>_>
             *)in_stack_fffffffffffffda0,(key_type_conflict *)in_stack_fffffffffffffd98);
  }
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
  if (bVar2) {
    peVar6 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x464572);
    iVar3 = (**(code **)(*(long *)peVar6 + 0x38))();
    if (4 < iVar3) {
      peVar6 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x4645ab);
      sVar5 = std::
              map<unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>_>
              ::size((map<unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>_>
                      *)0x4645c7);
      msg_if_given_abi_cxx11_((char *)local_c8,"remaining elems in waiting queue: %zu",sVar5);
      (**(code **)(*(long *)peVar6 + 0x40))
                (peVar6,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_client_request.cxx"
                 ,"handle_cli_req_callback",0xe7,local_c8);
      std::__cxx11::string::~string(local_c8);
    }
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x464658);
  peVar4 = std::
           __shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x464665);
  if (peVar4->result_code_ == OK) {
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
    if (bVar2) {
      peVar6 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x4646a3);
      iVar3 = (**(code **)(*(long *)peVar6 + 0x38))();
      if (4 < iVar3) {
        peVar6 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x4646dc);
        uVar9 = local_68;
        uVar1 = local_70;
        peVar7 = std::__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>::get(&local_80);
        msg_if_given_abi_cxx11_
                  ((char *)local_e8,"[OK] commit_ret_cv %lu wake up (%lu us), return value %p",uVar9
                   ,uVar1,peVar7);
        (**(code **)(*(long *)peVar6 + 0x40))
                  (peVar6,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_client_request.cxx"
                   ,"handle_cli_req_callback",0xec,local_e8);
        std::__cxx11::string::~string(local_e8);
      }
    }
  }
  else {
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
    if (bVar2) {
      peVar6 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x4647db);
      iVar3 = (**(code **)(*(long *)peVar6 + 0x38))();
      if (2 < iVar3) {
        peVar6 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x46480e);
        uVar1 = local_70;
        uVar9 = local_68;
        peVar7 = std::__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>::get(&local_80);
        peVar4 = std::
                 __shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x46484c);
        msg_if_given_abi_cxx11_
                  ((char *)local_108,
                   "[NOT OK] commit_ret_cv %lu wake up (%lu us), return value %p, result code %d",
                   uVar9,uVar1,peVar7,(ulong)(uint)peVar4->result_code_);
        (**(code **)(*(long *)peVar6 + 0x40))
                  (peVar6,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_client_request.cxx"
                   ,"handle_cli_req_callback",0xf1,local_108);
        std::__cxx11::string::~string(local_108);
      }
    }
    local_109 = check_leadership_validity(this_01);
    if ((bool)local_109) {
      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
      if (bVar2) {
        peVar6 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x46493f);
        iVar3 = (**(code **)(*(long *)peVar6 + 0x38))();
        if (3 < iVar3) {
          peVar6 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x464972);
          msg_if_given_abi_cxx11_((char *)local_130,"leadership is still valid");
          (**(code **)(*(long *)peVar6 + 0x40))
                    (peVar6,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_client_request.cxx"
                     ,"handle_cli_req_callback",0xf4,local_130);
          std::__cxx11::string::~string(local_130);
        }
      }
    }
    else {
      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
      if (bVar2) {
        peVar6 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x464a2b);
        iVar3 = (**(code **)(*(long *)peVar6 + 0x38))();
        if (1 < iVar3) {
          peVar6 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x464a5e);
          msg_if_given_abi_cxx11_((char *)local_150,"leadership is invalid");
          (**(code **)(*(long *)peVar6 + 0x40))
                    (peVar6,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_client_request.cxx"
                     ,"handle_cli_req_callback",0xf6,local_150);
          std::__cxx11::string::~string(local_150);
        }
      }
    }
  }
  std::__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x464af2);
  std::shared_ptr<nuraft::buffer>::shared_ptr
            ((shared_ptr<nuraft::buffer> *)in_stack_fffffffffffffda0,
             (shared_ptr<nuraft::buffer> *)in_stack_fffffffffffffd98);
  resp_msg::set_ctx(in_stack_fffffffffffffda0,(ptr<buffer> *)in_stack_fffffffffffffd98);
  std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x464b2f);
  this_00 = std::__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x464b3c);
  peVar4 = std::
           __shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x464b4e);
  resp_msg::set_result_code(this_00,peVar4->result_code_);
  std::shared_ptr<nuraft::resp_msg>::shared_ptr
            ((shared_ptr<nuraft::resp_msg> *)this_00,
             (shared_ptr<nuraft::resp_msg> *)in_stack_fffffffffffffd98);
  std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x464b82);
  pVar8.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar8.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_RDI;
  return (ptr<resp_msg>)pVar8.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_cli_req_callback(ptr<commit_ret_elem> elem,
                                                   ptr<resp_msg> resp) {
    p_dv("commit_ret_cv %" PRIu64 " %p sleep", elem->idx_, &elem->awaiter_);

    // Will wake up after timeout.
    elem->awaiter_.wait_ms(ctx_->get_params()->client_req_timeout_);

    uint64_t idx = 0;
    uint64_t elapsed_us = 0;
    ptr<buffer> ret_value = nullptr;
    {   auto_lock(commit_ret_elems_lock_);
        idx = elem->idx_;
        elapsed_us = elem->timer_.get_us();
        ret_value = elem->ret_value_;
        elem->callback_invoked_ = true;
        if (elem->result_code_ != cmd_result_code::TIMEOUT) {
            commit_ret_elems_.erase(elem->idx_);
        } else {
            p_dv("Client timeout leave commit thread to remove commit_ret_elem %" PRIu64,
                 idx);
        }
        p_dv("remaining elems in waiting queue: %zu", commit_ret_elems_.size());
    }

    if (elem->result_code_ == cmd_result_code::OK) {
        p_dv( "[OK] commit_ret_cv %" PRIu64 " wake up (%" PRIu64 " us), return value %p",
              idx, elapsed_us, ret_value.get() );
    } else {
        // Null `ret_value`, most likely timeout.
        p_wn( "[NOT OK] commit_ret_cv %" PRIu64 " wake up (%" PRIu64 " us), "
              "return value %p, result code %d",
              idx, elapsed_us, ret_value.get(), elem->result_code_ );
        bool valid_leader = check_leadership_validity();
        if (valid_leader) {
            p_in("leadership is still valid");
        } else {
            p_er("leadership is invalid");
        }
    }
    resp->set_ctx(ret_value);
    resp->set_result_code(elem->result_code_);

    return resp;
}